

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPUDPv4Transmitter::ComesFromThisTransmitter(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint16_t uVar1;
  AddressType AVar2;
  uint32_t uVar3;
  reference puVar4;
  bool local_69;
  iterator local_60;
  _List_const_iterator<unsigned_int> local_58;
  iterator local_50;
  _List_const_iterator<unsigned_int> local_48;
  _List_const_iterator<unsigned_int> local_40;
  const_iterator it;
  bool found;
  RTPIPv4Address *addr2;
  bool v;
  RTPAddress *addr_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (((this->created & 1U) == 0) ||
       (AVar2 = RTPAddress::GetAddressType(addr), AVar2 != IPv4Address)) {
      addr2._7_1_ = false;
    }
    else {
      it._M_node._7_1_ = 0;
      std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_40);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
      std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_48,&local_50);
      local_40._M_node = local_48._M_node;
      while( true ) {
        local_69 = false;
        if ((it._M_node._7_1_ & 1) == 0) {
          local_60._M_node =
               (_List_node_base *)
               std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->localIPs)
          ;
          std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_58,&local_60);
          local_69 = std::operator!=(&local_40,&local_58);
        }
        if (local_69 == false) break;
        uVar3 = RTPIPv4Address::GetIP((RTPIPv4Address *)addr);
        puVar4 = std::_List_const_iterator<unsigned_int>::operator*(&local_40);
        if (uVar3 == *puVar4) {
          it._M_node._7_1_ = 1;
        }
        else {
          std::_List_const_iterator<unsigned_int>::operator++(&local_40);
        }
      }
      if ((it._M_node._7_1_ & 1) == 0) {
        addr2._7_1_ = false;
      }
      else {
        uVar1 = RTPIPv4Address::GetPort((RTPIPv4Address *)addr);
        if ((uVar1 == this->m_rtpPort) ||
           (uVar1 = RTPIPv4Address::GetPort((RTPIPv4Address *)addr), uVar1 == this->m_rtcpPort)) {
          addr2._7_1_ = true;
        }
        else {
          addr2._7_1_ = false;
        }
      }
    }
    this_local._7_1_ = addr2._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv4Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv4Address)
	{	
		const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
		bool found = false;
		std::list<uint32_t>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			if (addr2->GetIP() == *it)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == m_rtpPort || addr2->GetPort() == m_rtcpPort) // check for RTP port and RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}